

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata *data)

{
  uint *puVar1;
  PcodeOp *pPVar2;
  ProtoStore *pPVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  uint uVar6;
  AddrSpace *spc;
  uintb off;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int4 iVar10;
  uint4 sz;
  undefined4 extraout_var;
  long *plVar11;
  Varnode *pVVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  AddrSpace *local_68;
  Address local_40;
  undefined4 extraout_var_00;
  
  bVar7 = FuncProto::isInputLocked(&fc->super_FuncProto);
  uVar13 = (fc->super_FuncProto).flags;
  iVar8 = (*((fc->super_FuncProto).model)->input->_vptr_ParamList[0xd])();
  local_68 = (AddrSpace *)CONCAT44(extraout_var,iVar8);
  if (!bVar7 || (uVar13 & 1) != 0) {
    FuncCallSpecs::initActiveInput(fc);
  }
  if (bVar7) {
    pPVar2 = fc->op;
    uVar9 = (*((fc->super_FuncProto).store)->_vptr_ProtoStore[5])();
    if (0 < (int)uVar9) {
      lVar14 = 0;
      uVar15 = 0;
      do {
        pPVar3 = (fc->super_FuncProto).store;
        iVar8 = (*pPVar3->_vptr_ProtoStore[6])(pPVar3,uVar15);
        plVar11 = (long *)CONCAT44(extraout_var_00,iVar8);
        (**(code **)(*plVar11 + 0x20))(&local_40,plVar11);
        iVar10 = (**(code **)(*plVar11 + 0x28))(plVar11);
        ParamActive::registerTrial(&fc->activeinput,&local_40,iVar10);
        puVar1 = (uint *)((long)&((fc->activeinput).trial.
                                  super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->flags + lVar14);
        *puVar1 = *puVar1 | 9;
        (**(code **)(*plVar11 + 0x20))(&local_40,plVar11);
        spc = local_40.base;
        (**(code **)(*plVar11 + 0x20))(&local_40,plVar11);
        off = local_40.offset;
        sz = (**(code **)(*plVar11 + 0x28))(plVar11);
        if (spc->type == IPTR_SPACEBASE) {
          pVVar12 = Funcdata::opStackLoad(data,spc,off,sz,pPVar2,(Varnode *)0x0,false);
          Funcdata::opInsertInput
                    (data,pPVar2,pVVar12,
                     (int4)((ulong)((long)(pPVar2->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar2->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
          uVar6 = uVar13 & 1;
          uVar13 = 1;
          if (uVar6 == 0) {
            Varnode::setFlags(pVVar12,0x1000);
            local_68 = (AddrSpace *)0x0;
          }
        }
        else {
          iVar10 = (**(code **)(*plVar11 + 0x28))(plVar11);
          (**(code **)(*plVar11 + 0x20))(&local_40,plVar11);
          pVVar12 = Funcdata::newVarnode(data,iVar10,&local_40,(Datatype *)0x0);
          Funcdata::opInsertInput
                    (data,pPVar2,pVVar12,
                     (int4)((ulong)((long)(pPVar2->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar2->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        uVar15 = (ulong)((int)uVar15 + 1);
        lVar14 = lVar14 + 0x30;
      } while ((ulong)uVar9 * 0x30 != lVar14);
    }
  }
  if (local_68 != (AddrSpace *)0x0) {
    pPVar2 = fc->op;
    ppVVar4 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVVar5 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar12 = Funcdata::opStackLoad(data,local_68,0,1,pPVar2,(Varnode *)0x0,false);
    iVar10 = (int4)((ulong)((long)ppVVar4 - (long)ppVVar5) >> 3);
    Funcdata::opInsertInput(data,pPVar2,pVVar12,iVar10);
    fc->stackPlaceholderSlot = iVar10;
    if (fc->isinputactive == true) {
      iVar8 = (fc->activeinput).slotbase;
      (fc->activeinput).stackplaceholder = iVar8;
      (fc->activeinput).slotbase = iVar8 + 1;
    }
    Varnode::setFlags(pVVar12,0x1000);
  }
  return;
}

Assistant:

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata &data)

{
  bool inputlocked = fc->isInputLocked();
  bool varargs = fc->isDotdotdot();
  AddrSpace *spacebase = fc->getSpacebase();	// Non-zero spacebase indicates we need a stackplaceholder
  ParamActive *active = fc->getActiveInput();

  if ((!inputlocked)||varargs)
    fc->initActiveInput();
  if (inputlocked) {
    PcodeOp *op = fc->getOp();
    int4 numparam = fc->numParams();
    bool setplaceholder = varargs;
    for(int4 i=0;i<numparam;++i) {
      ProtoParameter *param = fc->getParam(i);
      active->registerTrial(param->getAddress(),param->getSize());
      active->getTrial(i).markActive(); // Parameter is not optional
      AddrSpace *spc = param->getAddress().getSpace();
      uintb off = param->getAddress().getOffset();
      int4 sz = param->getSize();
      if (spc->getType() == IPTR_SPACEBASE) { // Param is stack relative
	Varnode *loadval = data.opStackLoad(spc,off,sz,op,(Varnode *)0,false);
	data.opInsertInput(op,loadval,op->numInput());
	if (!setplaceholder) {
	  setplaceholder = true;
	  loadval->setSpacebasePlaceholder();
	  spacebase = (AddrSpace *)0;	// With a locked stack parameter, we don't need a stackplaceholder
	}
      }
      else
	data.opInsertInput(op,data.newVarnode(param->getSize(),param->getAddress()),op->numInput());
    }
  }
  if (spacebase != (AddrSpace *)0) {	// If we need it, create the stackplaceholder
    PcodeOp *op = fc->getOp();
    int4 slot = op->numInput();
    Varnode *loadval = data.opStackLoad(spacebase,0,1,op,(Varnode *)0,false);
    data.opInsertInput(op,loadval,slot);
    fc->setStackPlaceholderSlot(slot);
    loadval->setSpacebasePlaceholder();
  }
}